

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall
Func::Func(Func *this,JitArenaAllocator *alloc,JITTimeWorkItem *workItem,
          ThreadContextInfo *threadContextInfo,ScriptContextInfo *scriptContextInfo,
          JITOutputIDL *outputData,EntryPointInfo *epInfo,FunctionJITRuntimeInfo *runtimeInfo,
          JITTimePolymorphicInlineCacheInfo *polymorphicInlineCacheInfo,void *codeGenAllocators,
          ScriptContextProfiler *codeGenProfiler,bool isBackgroundJIT,Func *parentFunc,
          uint postCallByteCodeOffset,RegSlot returnValueRegSlot,bool isInlinedConstructor,
          ProfileId callSiteIdInParentFunc,bool isGetterSetter)

{
  code *pcVar1;
  bool bVar2;
  CodeGenWorkItemType CVar3;
  ProfileId PVar4;
  RegSlot RVar5;
  RegSlot RVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  JITTimeProfileInfo *this_00;
  JITTimeFunctionBody *pJVar10;
  Func *pFVar11;
  JitArenaAllocator *pJVar12;
  SymTable *pSVar13;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar14;
  JITTimeConstructorCache **ppJVar15;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar16;
  ObjTypeSpecFldInfo **ppOVar17;
  JITTimeWorkItem *pJVar18;
  FunctionJITTimeInfo *pFVar19;
  ObjTypeSpecFldInfo *this_02;
  uint32 uVar20;
  bool local_28b;
  byte local_272;
  Func *local_188;
  ObjTypeSpecFldInfo *info;
  uint i;
  TrackAllocData local_130;
  code *local_108;
  undefined8 local_100;
  TrackAllocData local_f8;
  code *local_d0;
  undefined8 local_c8;
  TrackAllocData local_c0;
  code *local_98;
  undefined8 local_90;
  TrackAllocData local_88;
  byte local_5a;
  byte local_59;
  uint32 local_58;
  bool doStackClosure;
  bool doStackNestedFunc;
  RegSlot tmpResult;
  byte local_43;
  byte local_42;
  byte local_41;
  bool isGetterSetter_local;
  bool isInlinedConstructor_local;
  JITOutputIDL *pJStack_40;
  bool isBackgroundJIT_local;
  JITOutputIDL *outputData_local;
  ScriptContextInfo *scriptContextInfo_local;
  ThreadContextInfo *threadContextInfo_local;
  JITTimeWorkItem *workItem_local;
  JitArenaAllocator *alloc_local;
  Func *this_local;
  
  local_41 = isBackgroundJIT;
  local_42 = isInlinedConstructor;
  local_43 = isGetterSetter;
  this->m_alloc = alloc;
  this->m_runtimeInfo = runtimeInfo;
  this->m_threadContextInfo = threadContextInfo;
  this->m_scriptContextInfo = scriptContextInfo;
  this->m_workItem = workItem;
  this->m_polymorphicInlineCacheInfo = polymorphicInlineCacheInfo;
  this->pinnedTypeRefs = (TypeRefSet *)0x0;
  this->singleTypeGuards = (TypePropertyGuardDictionary *)0x0;
  this->equivalentTypeGuards = (EquivalentTypeGuardList *)0x0;
  this->propertyGuardsByPropertyId = (PropertyGuardByPropertyIdMap *)0x0;
  this->ctorCachesByPropertyId = (CtorCachesByPropertyIdMap *)0x0;
  this->callSiteToArgumentsOffsetFixupMap = (CallSiteToArgumentsOffsetFixupMap *)0x0;
  this->indexedPropertyGuardCount = 0;
  this->propertiesWrittenTo = (PropertyIdSet *)0x0;
  pJStack_40 = outputData;
  outputData_local = (JITOutputIDL *)scriptContextInfo;
  scriptContextInfo_local = (ScriptContextInfo *)threadContextInfo;
  threadContextInfo_local = (ThreadContextInfo *)workItem;
  workItem_local = (JITTimeWorkItem *)alloc;
  alloc_local = (JitArenaAllocator *)this;
  JsUtil::
  BaseHashSet<int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(&this->lazyBailoutProperties,alloc,0);
  this->anyPropertyMayBeWrittenTo = false;
  this->frameDisplayCheckTable = (FrameDisplayCheckTable *)0x0;
  PrologEncoder::PrologEncoder(&this->m_prologEncoder);
  this->m_forInLoopBaseDepth = 0;
  this->m_forInEnumeratorArrayOffset = -1;
  this->m_localStackHeight = 0;
  this->frameSize = 0;
  this->postCallByteCodeOffset = postCallByteCodeOffset;
  this->returnValueRegSlot = returnValueRegSlot;
  this->firstIRTemp = 0;
  this->actualCount = 0xffff;
  this->firstActualStackOffset = -1;
  this->tryCatchNestingLevel = 0;
  this->m_totalJumpTableSizeInBytesForSwitchStatements = 0;
  this->m_funcStartLabel = (LabelInstr *)0x0;
  this->m_funcEndLabel = (LabelInstr *)0x0;
  this->m_argSlotsForFunctionsCalled = 0;
  this->m_callSiteCount = 0;
  this->m_fg = (FlowGraph *)0x0;
  this->m_labelCount = 0;
  BVUnitT<unsigned_long>::BVUnitT(&this->m_regsUsed,0);
  this->loopCount = 0;
  this->unoptimizableArgumentsObjReference = 0;
  this->unoptimizableArgumentsObjReferenceInInlinees = 0;
  this->callSiteIdInParentFunc = callSiteIdInParentFunc;
  this->cachedInlineeFrameInfo = (InlineeFrameInfo *)0x0;
  this->field_0x240 = this->field_0x240 & 0xfe;
  this->field_0x240 = this->field_0x240 & 0xfd;
  this->field_0x240 = this->field_0x240 & 0xfb;
  this->field_0x240 = this->field_0x240 & 0xf7;
  this->field_0x240 = this->field_0x240 & 0xef;
  this->field_0x240 = this->field_0x240 & 0xdf;
  this->field_0x240 = this->field_0x240 & 0xbf;
  this->field_0x240 = this->field_0x240 & 0x7f;
  this->field_0x241 = this->field_0x241 & 0xfe;
  this->field_0x241 = this->field_0x241 & 0xfd;
  this->field_0x241 = this->field_0x241 & 0xfb;
  this->field_0x241 = this->field_0x241 | 8;
  this->field_0x241 = this->field_0x241 & 0xef;
  *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 & 0xffffdfff | (local_43 & 1) << 0xd;
  *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 & 0xffffbfff | (local_42 & 1) << 0xe;
  this->field_0x241 = this->field_0x241 & 0x7f;
  this->field_0x242 = this->field_0x242 & 0xfe;
  this->field_0x242 = this->field_0x242 & 0xfd;
  this->field_0x242 = this->field_0x242 & 0xfb;
  this->field_0x242 = this->field_0x242 & 0xf7;
  this->field_0x242 = this->field_0x242 & 0xef;
  this->field_0x242 = this->field_0x242 & 0xdf;
  this->field_0x242 = this->field_0x242 & 0xbf;
  this->field_0x242 = this->field_0x242 & 0x7f;
  this->field_0x243 = this->field_0x243 & 0xfe;
  this->field_0x243 = this->field_0x243 & 0xfd;
  this->byteCodeRegisterUses = (ByteCodeRegisterUses *)0x0;
  JsUtil::Stack<Js::Phase,_Memory::ArenaAllocator,_false,_DefaultComparer>::Stack
            (&this->currentPhases,(ArenaAllocator *)workItem_local);
  this->allowRemoveBailOutArgInstr = false;
  this->argObjSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->m_nonTempLocalVars = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->frameInfo = (InlineeFrameInfo *)0x0;
  this->argInsCount = 0;
  this->m_inlineeId = 0;
  this->m_bailOutForElidedYieldInsertionPoint = (Instr *)0x0;
  this->m_entryPointInfo = epInfo;
  JITOutput::JITOutput(&this->m_output,pJStack_40);
  this->m_codeGenProfiler = codeGenProfiler;
  local_188 = this;
  if (parentFunc != (Func *)0x0) {
    local_188 = parentFunc->topFunc;
  }
  this->topFunc = local_188;
  this->parentFunc = parentFunc;
  this->inlineeStart = (Instr *)0x0;
  this->maxInlineeArgOutSize = 0;
  this->m_isBackgroundJIT = (bool)(local_41 & 1);
  this->hasInstrNumber = false;
  this->maintainByteCodeOffset = true;
  this->hasInlinee = false;
  this->thisOrParentInlinerHasArguments = false;
  this->stackNestedFunc = false;
  this->stackClosure = false;
  this->hasAnyStackNestedFunc = false;
  this->hasMarkTempObjects = false;
  this->hasNonSimpleParams = false;
  this->m_cloner = (Cloner *)0x0;
  this->m_cloneMap = (InstrMap *)0x0;
  NativeCodeData::Allocator::Allocator(&this->nativeCodeDataAllocator);
  NativeCodeData::Allocator::Allocator(&this->transferDataAllocator);
  this->m_localVarSlotsOffset = -1;
  this->m_hasLocalVarChangedOffset = -1;
  this->m_codeGenAllocators = codeGenAllocators;
  this->m_yieldOffsetResumeLabelList = (YieldOffsetResumeLabelList *)0x0;
  this->stackArgWithFormalsTracker = (StackArgWithFormalsTracker *)0x0;
  this->m_globalObjTypeSpecFldInfoArray = (ObjTypeSpecFldInfo **)0x0;
  SList<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::SList
            (&this->constantAddressRegOpnd,(ArenaAllocator *)workItem_local);
  this->lastConstantAddressRegLoadInstr = (Instr *)0x0;
  this->vtableMap = (VtableHashMap *)0x0;
  this->m_lowerer = (Lowerer *)0x0;
  this->m_localClosureSym = (StackSym *)0x0;
  this->m_paramClosureSym = (StackSym *)0x0;
  this->m_localFrameDisplaySym = (StackSym *)0x0;
  this->m_nativeCodeDataSym = (StackSym *)0x0;
  this->m_inlineeFrameStartSym = (StackSym *)0x0;
  this->m_loopParamSym = (StackSym *)0x0;
  this->m_bailoutReturnValueSym = (StackSym *)0x0;
  this->m_hasBailedOutSym = (StackSym *)0x0;
  this->m_generatorFrameSym = (StackSym *)0x0;
  this->tempSymDouble = (StackSym *)0x0;
  this->tempSymBool = (StackSym *)0x0;
  this->field_0x410 = this->field_0x410 & 0xfe;
  this->m_lazyBailOutRecordSlot = (StackSym *)0x0;
  bVar2 = IsInlined(this);
  if (bVar2 != (runtimeInfo != (FunctionJITRuntimeInfo *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0xa4,"(this->IsInlined() == !!runtimeInfo)",
                       "this->IsInlined() == !!runtimeInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar2 = HasProfileInfo(this);
  if (bVar2) {
    this_00 = GetReadOnlyProfileInfo(this);
    uVar7 = JITTimeProfileInfo::GetLoopCount(this_00);
    pJVar10 = GetJITFunctionBody(this);
    uVar8 = JITTimeFunctionBody::GetLoopCount(pJVar10);
    if (uVar7 != uVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xa6,
                         "(!HasProfileInfo() || GetReadOnlyProfileInfo()->GetLoopCount() == GetJITFunctionBody()->GetLoopCount())"
                         ,
                         "!HasProfileInfo() || GetReadOnlyProfileInfo()->GetLoopCount() == GetJITFunctionBody()->GetLoopCount()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  pJVar10 = GetJITFunctionBody(this);
  RVar5 = JITTimeFunctionBody::GetConstCount(pJVar10);
  pJVar10 = GetJITFunctionBody(this);
  RVar6 = JITTimeFunctionBody::GetVarCount(pJVar10);
  bVar2 = UInt32Math::Add(RVar5,RVar6,&local_58);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0xa8,
                       "(!UInt32Math::Add(GetJITFunctionBody()->GetConstCount(), GetJITFunctionBody()->GetVarCount(), &tmpResult))"
                       ,
                       "!UInt32Math::Add(GetJITFunctionBody()->GetConstCount(), GetJITFunctionBody()->GetVarCount(), &tmpResult)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pJVar10 = GetJITFunctionBody(this);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar10);
  if (!bVar2) {
    pJVar10 = GetJITFunctionBody(this);
    RVar5 = JITTimeFunctionBody::GetFirstTmpReg(pJVar10);
    pJVar10 = GetJITFunctionBody(this);
    RVar6 = JITTimeFunctionBody::GetLocalsCount(pJVar10);
    if (RVar6 < RVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xa9,
                         "(GetJITFunctionBody()->IsAsmJsMode() || GetJITFunctionBody()->GetFirstTmpReg() <= GetJITFunctionBody()->GetLocalsCount())"
                         ,
                         "GetJITFunctionBody()->IsAsmJsMode() || GetJITFunctionBody()->GetFirstTmpReg() <= GetJITFunctionBody()->GetLocalsCount()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  bVar2 = IsLoopBody(this);
  if (bVar2) {
    uVar7 = JITTimeWorkItem::GetLoopNumber(this->m_workItem);
    pJVar10 = GetJITFunctionBody(this);
    uVar8 = JITTimeFunctionBody::GetLoopCount(pJVar10);
    if (uVar8 <= uVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xaa,
                         "(!IsLoopBody() || m_workItem->GetLoopNumber() < GetJITFunctionBody()->GetLoopCount())"
                         ,
                         "!IsLoopBody() || m_workItem->GetLoopNumber() < GetJITFunctionBody()->GetLoopCount()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  if (((DAT_01eb89ea & 1) == 0) &&
     (bVar2 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,ForceNativeFlag), !bVar2)) {
    pJVar10 = GetJITFunctionBody(this);
    uVar7 = JITTimeFunctionBody::GetByteCodeLength(pJVar10);
    if (DAT_01eafdcc <= uVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xab,
                         "((Js::Configuration::Global.flags.Prejit) || (Js::Configuration::Global.flags.IsEnabled(Js::ForceNativeFlag)) || GetJITFunctionBody()->GetByteCodeLength() < (uint)(Js::Configuration::Global.flags.MaxJITFunctionBytecodeByteLength))"
                         ,
                         "(Js::Configuration::Global.flags.Prejit) || (Js::Configuration::Global.flags.IsEnabled(Js::ForceNativeFlag)) || GetJITFunctionBody()->GetByteCodeLength() < (uint)(Js::Configuration::Global.flags.MaxJITFunctionBytecodeByteLength)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  pJVar10 = GetJITFunctionBody(this);
  JITTimeFunctionBody::EnsureConsistentConstCount(pJVar10);
  bVar2 = IsTopFunc(this);
  if (bVar2) {
    pJStack_40->hasJittedStackClosure = '\0';
    pJStack_40->localVarSlotsOffset = this->m_localVarSlotsOffset;
    pJStack_40->localVarChangedOffset = this->m_hasLocalVarChangedOffset;
  }
  bVar2 = IsInlined(this);
  if (bVar2) {
    pFVar11 = GetTopFunc(this);
    uVar20 = pFVar11->m_inlineeId + 1;
    pFVar11->m_inlineeId = uVar20;
    this->m_inlineeId = uVar20;
  }
  pJVar10 = GetJITFunctionBody(this);
  local_59 = JITTimeFunctionBody::DoStackNestedFunc(pJVar10);
  pJVar10 = GetJITFunctionBody(this);
  bVar2 = JITTimeFunctionBody::DoStackClosure(pJVar10);
  local_272 = 0;
  if (bVar2) {
    uVar7 = GetSourceContextId(this);
    uVar8 = GetLocalFunctionId(this);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FrameDisplayFastPathPhase,uVar7,uVar8);
    local_272 = 0;
    if (!bVar2) {
      uVar7 = GetSourceContextId(this);
      uVar8 = GetLocalFunctionId(this);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,StackClosurePhase,uVar7,uVar8);
      local_272 = bVar2 ^ 0xff;
    }
  }
  local_5a = local_272 & 1;
  if ((local_5a != 0) && ((local_59 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0xbc,"(!doStackClosure || doStackNestedFunc)",
                       "!doStackClosure || doStackNestedFunc");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  local_28b = false;
  if ((local_5a & 1) != 0) {
    local_28b = IsTopFunc(this);
  }
  this->stackClosure = local_28b;
  if ((this->stackClosure & 1U) != 0) {
    JITOutput::SetHasJITStackClosure(&this->m_output);
  }
  CVar3 = JITTimeWorkItem::Type(this->m_workItem);
  if (CVar3 == JsFunctionType) {
    pJVar10 = GetJITFunctionBody(this);
    bVar2 = JITTimeFunctionBody::DoBackendArgumentsOptimization(pJVar10);
    if (bVar2) {
      pJVar10 = GetJITFunctionBody(this);
      bVar2 = JITTimeFunctionBody::HasTry(pJVar10);
      if ((!bVar2) || (bVar2 = DoOptimizeTry(this), bVar2)) {
        SetHasStackArgs(this,true);
      }
    }
  }
  if ((local_59 & 1) != 0) {
    pJVar10 = GetJITFunctionBody(this);
    uVar7 = JITTimeFunctionBody::GetNestedCount(pJVar10);
    if (uVar7 != 0) {
      bVar2 = IsTopFunc(this);
      if (!bVar2) {
        pFVar11 = GetTopFunc(this);
        CVar3 = JITTimeWorkItem::Type(pFVar11->m_workItem);
        if (CVar3 == JsLoopBodyWorkItemType) goto LAB_00550028;
      }
      bVar2 = IsJitInDebugMode(this);
      if (bVar2) {
        pJVar10 = GetJITFunctionBody(this);
        bVar2 = JITTimeFunctionBody::IsLibraryCode(pJVar10);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                             ,0xcf,
                             "(!(this->IsJitInDebugMode() && !GetJITFunctionBody()->IsLibraryCode()))"
                             ,
                             "!(this->IsJitInDebugMode() && !GetJITFunctionBody()->IsLibraryCode())"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
      }
      this->stackNestedFunc = true;
      pFVar11 = GetTopFunc(this);
      pFVar11->hasAnyStackNestedFunc = true;
    }
  }
LAB_00550028:
  pJVar10 = GetJITFunctionBody(this);
  bVar2 = JITTimeFunctionBody::HasOrParentHasArguments(pJVar10);
  pJVar18 = workItem_local;
  if ((bVar2) ||
     ((parentFunc != (Func *)0x0 && ((parentFunc->thisOrParentInlinerHasArguments & 1U) != 0)))) {
    this->thisOrParentInlinerHasArguments = true;
  }
  if (parentFunc == (Func *)0x0) {
    this->inlineDepth = 0;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,(type_info *)&SymTable::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
               ,0xdc);
    pJVar12 = (JitArenaAllocator *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             pJVar18,&local_88);
    local_98 = Memory::JitArenaAllocator::Alloc;
    local_90 = 0;
    pSVar13 = (SymTable *)new<Memory::JitArenaAllocator>(0x10040,pJVar12,0x4e98c0);
    SymTable::SymTable(pSVar13);
    this->m_symTable = pSVar13;
    SymTable::Init(this->m_symTable,this);
    pSVar13 = this->m_symTable;
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody((JITTimeWorkItem *)threadContextInfo_local);
    RVar5 = JITTimeFunctionBody::GetLocalsCount(pJVar10);
    SymTable::SetStartingID(pSVar13,RVar5 + 1);
    if (postCallByteCodeOffset != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xe0,"(Js::Constants::NoByteCodeOffset == postCallByteCodeOffset)",
                         "Js::Constants::NoByteCodeOffset == postCallByteCodeOffset");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    if (returnValueRegSlot != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xe1,"(Js::Constants::NoRegister == returnValueRegSlot)",
                         "Js::Constants::NoRegister == returnValueRegSlot");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    bVar2 = HasArgumentSlot(this);
    if (bVar2) {
      this->m_localStackHeight = 8;
    }
  }
  else {
    this->inlineDepth = parentFunc->inlineDepth + 1;
    if (postCallByteCodeOffset == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0xef,"(Js::Constants::NoByteCodeOffset != postCallByteCodeOffset)",
                         "Js::Constants::NoByteCodeOffset != postCallByteCodeOffset");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  this->constructorCacheCount = 0;
  pJVar12 = this->m_alloc;
  pJVar10 = GetJITFunctionBody(this);
  PVar4 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar10);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_c0,(type_info *)&JITTimeConstructorCache*::typeinfo,0,(ulong)PVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
             ,0xf3);
  pAVar14 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           pJVar12,&local_c0);
  pJVar10 = GetJITFunctionBody(this);
  PVar4 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar10);
  local_d0 = Memory::ArenaAllocator::AllocZero;
  local_c8 = 0;
  ppJVar15 = Memory::AllocateArray<Memory::ArenaAllocator,JITTimeConstructorCache*,false>
                       ((Memory *)pAVar14,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                        (ulong)PVar4);
  this->constructorCaches = ppJVar15;
  this->m_codeSize = -1;
  this->m_spillSize = -1;
  this->m_argsSize = -1;
  this->m_savedRegSize = -1;
  bVar2 = IsJitInDebugMode(this);
  if (bVar2) {
    pJVar12 = this->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_f8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
               ,0x101);
    pAVar14 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             pJVar12,&local_f8);
    local_108 = Memory::ArenaAllocator::Alloc;
    local_100 = 0;
    this_01 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar14,0x3f67b0);
    BVSparse<Memory::JitArenaAllocator>::BVSparse(this_01,this->m_alloc);
    this->m_nonTempLocalVars = this_01;
  }
  pJVar10 = GetJITFunctionBody(this);
  bVar2 = JITTimeFunctionBody::IsCoroutine(pJVar10);
  if (bVar2) {
    pLVar16 = JsUtil::
              List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::New(this->m_alloc,4);
    this->m_yieldOffsetResumeLabelList = pLVar16;
  }
  bVar2 = IsTopFunc(this);
  if (bVar2) {
    pJVar12 = this->m_alloc;
    pJVar18 = GetWorkItem(this);
    pFVar19 = JITTimeWorkItem::GetJITTimeInfo(pJVar18);
    uVar7 = FunctionJITTimeInfo::GetGlobalObjTypeSpecFldInfoCount(pFVar19);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_130,(type_info *)&ObjTypeSpecFldInfo*::typeinfo,0,(ulong)uVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
               ,0x10b);
    pAVar14 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             pJVar12,&local_130);
    pJVar18 = GetWorkItem(this);
    pFVar19 = JITTimeWorkItem::GetJITTimeInfo(pJVar18);
    uVar7 = FunctionJITTimeInfo::GetGlobalObjTypeSpecFldInfoCount(pFVar19);
    ppOVar17 = Memory::AllocateArray<Memory::JitArenaAllocator,ObjTypeSpecFldInfo*,false>
                         ((Memory *)pAVar14,
                          (JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero,0,(ulong)uVar7);
    this->m_globalObjTypeSpecFldInfoArray = ppOVar17;
  }
  info._4_4_ = 0;
  do {
    pJVar10 = GetJITFunctionBody(this);
    uVar7 = JITTimeFunctionBody::GetInlineCacheCount(pJVar10);
    if (uVar7 <= info._4_4_) {
      uVar7 = GetSourceContextId(this);
      uVar8 = GetLocalFunctionId(this);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,HoistConstAddrPhase,uVar7,uVar8);
      this->canHoistConstantAddressLoad = (bool)(~bVar2 & 1);
      pJVar10 = GetJITFunctionBody(this);
      uVar7 = JITTimeFunctionBody::GetForInLoopDepth(pJVar10);
      this->m_forInLoopMaxDepth = uVar7;
      return;
    }
    pJVar18 = GetWorkItem(this);
    pFVar19 = JITTimeWorkItem::GetJITTimeInfo(pJVar18);
    this_02 = FunctionJITTimeInfo::GetObjTypeSpecFldInfo(pFVar19,info._4_4_);
    if (this_02 != (ObjTypeSpecFldInfo *)0x0) {
      uVar7 = ObjTypeSpecFldInfo::GetObjTypeSpecFldId(this_02);
      pFVar11 = GetTopFunc(this);
      pJVar18 = GetWorkItem(pFVar11);
      pFVar19 = JITTimeWorkItem::GetJITTimeInfo(pJVar18);
      uVar8 = FunctionJITTimeInfo::GetGlobalObjTypeSpecFldInfoCount(pFVar19);
      if (uVar8 <= uVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x113,
                           "(info->GetObjTypeSpecFldId() < GetTopFunc()->GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount())"
                           ,
                           "info->GetObjTypeSpecFldId() < GetTopFunc()->GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount()"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pFVar11 = GetTopFunc(this);
      ppOVar17 = pFVar11->m_globalObjTypeSpecFldInfoArray;
      uVar7 = ObjTypeSpecFldInfo::GetObjTypeSpecFldId(this_02);
      ppOVar17[uVar7] = this_02;
    }
    info._4_4_ = info._4_4_ + 1;
  } while( true );
}

Assistant:

Func::Func(JitArenaAllocator *alloc, JITTimeWorkItem * workItem,
    ThreadContextInfo * threadContextInfo,
    ScriptContextInfo * scriptContextInfo,
    JITOutputIDL * outputData,
    Js::EntryPointInfo* epInfo,
    const FunctionJITRuntimeInfo *const runtimeInfo,
    JITTimePolymorphicInlineCacheInfo * const polymorphicInlineCacheInfo, void * const codeGenAllocators,
#if !FLOATVAR
    CodeGenNumberAllocator * numberAllocator,
#endif
    Js::ScriptContextProfiler *const codeGenProfiler, const bool isBackgroundJIT, Func * parentFunc,
    uint postCallByteCodeOffset, Js::RegSlot returnValueRegSlot, const bool isInlinedConstructor,
    Js::ProfileId callSiteIdInParentFunc, bool isGetterSetter) :
    m_alloc(alloc),
    m_workItem(workItem),
    m_output(outputData),
    m_entryPointInfo(epInfo),
    m_threadContextInfo(threadContextInfo),
    m_scriptContextInfo(scriptContextInfo),
    m_runtimeInfo(runtimeInfo),
    m_polymorphicInlineCacheInfo(polymorphicInlineCacheInfo),
    m_codeGenAllocators(codeGenAllocators),
    m_inlineeId(0),
    pinnedTypeRefs(nullptr),
    singleTypeGuards(nullptr),
    equivalentTypeGuards(nullptr),
    propertyGuardsByPropertyId(nullptr),
    ctorCachesByPropertyId(nullptr),
    callSiteToArgumentsOffsetFixupMap(nullptr),
    indexedPropertyGuardCount(0),
    propertiesWrittenTo(nullptr),
    lazyBailoutProperties(alloc),
    anyPropertyMayBeWrittenTo(false),
#ifdef PROFILE_EXEC
    m_codeGenProfiler(codeGenProfiler),
#endif
    m_isBackgroundJIT(isBackgroundJIT),
    m_cloner(nullptr),
    m_cloneMap(nullptr),
    m_loopParamSym(nullptr),
    m_localClosureSym(nullptr),
    m_paramClosureSym(nullptr),
    m_localFrameDisplaySym(nullptr),
    m_bailoutReturnValueSym(nullptr),
    m_hasBailedOutSym(nullptr),
    m_inlineeFrameStartSym(nullptr),
    inlineeStart(nullptr),
    m_regsUsed(0),
    m_fg(nullptr),
    m_labelCount(0),
    m_argSlotsForFunctionsCalled(0),
    m_hasCalls(false),
    m_hasInlineArgsOpt(false),
    m_hasInlineOverheadRemoved(false),
    m_canDoInlineArgsOpt(true),
    unoptimizableArgumentsObjReference(0),
    unoptimizableArgumentsObjReferenceInInlinees(0),
    m_doFastPaths(false),
    hasBailout(false),
    firstIRTemp(0),
    hasBailoutInEHRegion(false),
    hasInstrNumber(false),
    maintainByteCodeOffset(true),
    frameSize(0),
    topFunc(parentFunc ? parentFunc->topFunc : this),
    parentFunc(parentFunc),
    argObjSyms(nullptr),
    m_nonTempLocalVars(nullptr),
    hasAnyStackNestedFunc(false),
    hasMarkTempObjects(false),
    postCallByteCodeOffset(postCallByteCodeOffset),
    maxInlineeArgOutSize(0),
    returnValueRegSlot(returnValueRegSlot),
    firstActualStackOffset(-1),
    m_localVarSlotsOffset(Js::Constants::InvalidOffset),
    m_hasLocalVarChangedOffset(Js::Constants::InvalidOffset),
    actualCount((Js::ArgSlot) - 1),
    tryCatchNestingLevel(0),
    m_localStackHeight(0),
    tempSymDouble(nullptr),
    tempSymBool(nullptr),
    hasInlinee(false),
    thisOrParentInlinerHasArguments(false),
    hasStackArgs(false),
    hasArgLenAndConstOpt(false),
    hasImplicitParamLoad(false),
    hasThrow(false),
    hasNonSimpleParams(false),
    hasUnoptimizedArgumentsAccess(false),
    applyTargetInliningRemovedArgumentsAccess(false),
    hasImplicitCalls(false),
    hasTempObjectProducingInstr(false),
    isInlinedConstructor(isInlinedConstructor),
#if !FLOATVAR
    numberAllocator(numberAllocator),
#endif
    loopCount(0),
    callSiteIdInParentFunc(callSiteIdInParentFunc),
    isGetterSetter(isGetterSetter),
    cachedInlineeFrameInfo(nullptr),
    frameInfo(nullptr),
    isTJLoopBody(false),
    m_nativeCodeDataSym(nullptr),
    isFlowGraphValid(false),
    legalizePostRegAlloc(false),
#if DBG
    m_callSiteCount(0),
#endif
    stackNestedFunc(false),
    stackClosure(false)
#if defined(_M_ARM32_OR_ARM64)
    , m_ArgumentsOffset(0)
    , m_epilogLabel(nullptr)
#endif
    , m_funcStartLabel(nullptr)
    , m_funcEndLabel(nullptr)
#if DBG
    , hasCalledSetDoFastPaths(false)
    , allowRemoveBailOutArgInstr(false)
    , currentPhases(alloc)
    , isPostLower(false)
    , isPostRegAlloc(false)
    , isPostPeeps(false)
    , isPostLayout(false)
    , isPostFinalLower(false)
    , vtableMap(nullptr)
#endif
    , m_yieldOffsetResumeLabelList(nullptr)
    , m_bailOutForElidedYieldInsertionPoint(nullptr)
    , constantAddressRegOpnd(alloc)
    , lastConstantAddressRegLoadInstr(nullptr)
    , m_totalJumpTableSizeInBytesForSwitchStatements(0)
    , frameDisplayCheckTable(nullptr)
    , stackArgWithFormalsTracker(nullptr)
    , m_forInLoopBaseDepth(0)
    , m_forInEnumeratorArrayOffset(-1)
    , argInsCount(0)
    , m_globalObjTypeSpecFldInfoArray(nullptr)
    , m_generatorFrameSym(nullptr)
#if LOWER_SPLIT_INT64
    , m_int64SymPairMap(nullptr)
#endif
#ifdef RECYCLER_WRITE_BARRIER_JIT
    , m_lowerer(nullptr)
#endif
    , m_lazyBailOutRecordSlot(nullptr)
    , hasLazyBailOut(false)
{

    Assert(this->IsInlined() == !!runtimeInfo);

    AssertOrFailFast(!HasProfileInfo() || GetReadOnlyProfileInfo()->GetLoopCount() == GetJITFunctionBody()->GetLoopCount());
    Js::RegSlot tmpResult;
    AssertOrFailFast(!UInt32Math::Add(GetJITFunctionBody()->GetConstCount(), GetJITFunctionBody()->GetVarCount(), &tmpResult));
    AssertOrFailFast(GetJITFunctionBody()->IsAsmJsMode() || GetJITFunctionBody()->GetFirstTmpReg() <= GetJITFunctionBody()->GetLocalsCount());
    AssertOrFailFast(!IsLoopBody() || m_workItem->GetLoopNumber() < GetJITFunctionBody()->GetLoopCount());
    AssertOrFailFast(CONFIG_FLAG(Prejit) || CONFIG_ISENABLED(Js::ForceNativeFlag) || GetJITFunctionBody()->GetByteCodeLength() < (uint)CONFIG_FLAG(MaxJITFunctionBytecodeByteLength));
    GetJITFunctionBody()->EnsureConsistentConstCount();

    if (this->IsTopFunc())
    {
        outputData->hasJittedStackClosure = false;
        outputData->localVarSlotsOffset = m_localVarSlotsOffset;
        outputData->localVarChangedOffset = m_hasLocalVarChangedOffset;
    }

    if (this->IsInlined())
    {
        m_inlineeId = ++(GetTopFunc()->m_inlineeId);
    }
    bool doStackNestedFunc = GetJITFunctionBody()->DoStackNestedFunc();

    bool doStackClosure = GetJITFunctionBody()->DoStackClosure() && !PHASE_OFF(Js::FrameDisplayFastPathPhase, this) && !PHASE_OFF(Js::StackClosurePhase, this);
    Assert(!doStackClosure || doStackNestedFunc);
    this->stackClosure = doStackClosure && this->IsTopFunc();
    if (this->stackClosure)
    {
        // TODO: calculate on runtime side?
        m_output.SetHasJITStackClosure();
    }

    if (m_workItem->Type() == JsFunctionType &&
        GetJITFunctionBody()->DoBackendArgumentsOptimization() &&
        (!GetJITFunctionBody()->HasTry() || this->DoOptimizeTry()))
    {
        // doBackendArgumentsOptimization bit is set when there is no eval inside a function
        // as determined by the bytecode generator.
        SetHasStackArgs(true);
    }
    if (doStackNestedFunc && GetJITFunctionBody()->GetNestedCount() != 0 &&
        (this->IsTopFunc() || this->GetTopFunc()->m_workItem->Type() != JsLoopBodyWorkItemType)) // make sure none of the functions inlined in a jitted loop body allocate nested functions on the stack
    {
        Assert(!(this->IsJitInDebugMode() && !GetJITFunctionBody()->IsLibraryCode()));
        stackNestedFunc = true;
        this->GetTopFunc()->hasAnyStackNestedFunc = true;
    }

    if (GetJITFunctionBody()->HasOrParentHasArguments() || (parentFunc && parentFunc->thisOrParentInlinerHasArguments))
    {
        thisOrParentInlinerHasArguments = true;
    }

    if (parentFunc == nullptr)
    {
        inlineDepth = 0;
        m_symTable = JitAnew(alloc, SymTable);
        m_symTable->Init(this);
        m_symTable->SetStartingID(static_cast<SymID>(workItem->GetJITFunctionBody()->GetLocalsCount() + 1));

        Assert(Js::Constants::NoByteCodeOffset == postCallByteCodeOffset);
        Assert(Js::Constants::NoRegister == returnValueRegSlot);

#if defined(_M_IX86) ||  defined(_M_X64)
        if (HasArgumentSlot())
        {
            // Pre-allocate the single argument slot we'll reserve for the arguments object.
            // For ARM, the argument slot is not part of the local but part of the register saves
            m_localStackHeight = MachArgsSlotOffset;
        }
#endif
    }
    else
    {
        inlineDepth = parentFunc->inlineDepth + 1;
        Assert(Js::Constants::NoByteCodeOffset != postCallByteCodeOffset);
    }

    this->constructorCacheCount = 0;
    this->constructorCaches = AnewArrayZ(this->m_alloc, JITTimeConstructorCache*, GetJITFunctionBody()->GetProfiledCallSiteCount());

#if DBG_DUMP
    m_codeSize = -1;
#endif

#if defined(_M_X64)
    m_spillSize = -1;
    m_argsSize = -1;
    m_savedRegSize = -1;
#endif

    if (this->IsJitInDebugMode())
    {
        m_nonTempLocalVars = Anew(this->m_alloc, BVSparse<JitArenaAllocator>, this->m_alloc);
    }

    if (GetJITFunctionBody()->IsCoroutine())
    {
        m_yieldOffsetResumeLabelList = YieldOffsetResumeLabelList::New(this->m_alloc);
    }

    if (this->IsTopFunc())
    {
        m_globalObjTypeSpecFldInfoArray = JitAnewArrayZ(this->m_alloc, ObjTypeSpecFldInfo*, GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount());
    }

    for (uint i = 0; i < GetJITFunctionBody()->GetInlineCacheCount(); ++i)
    {
        ObjTypeSpecFldInfo * info = GetWorkItem()->GetJITTimeInfo()->GetObjTypeSpecFldInfo(i);
        if (info != nullptr)
        {
            AssertOrFailFast(info->GetObjTypeSpecFldId() < GetTopFunc()->GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount());
            GetTopFunc()->m_globalObjTypeSpecFldInfoArray[info->GetObjTypeSpecFldId()] = info;
        }
    }

    canHoistConstantAddressLoad = !PHASE_OFF(Js::HoistConstAddrPhase, this);

    m_forInLoopMaxDepth = this->GetJITFunctionBody()->GetForInLoopDepth();
}